

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.hpp
# Opt level: O2

bool __thiscall tcmalloc::PageHeap::CheckSmallList(PageHeap *this)

{
  PageMap *this_00;
  Span *pSVar1;
  long lVar2;
  int iVar3;
  Span *pSVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  
  this_00 = &this->page_map_;
  lVar2 = 0;
  uVar6 = 0;
  uVar5 = 0;
  do {
    if (lVar2 == 0x80) {
      if (uVar6 != (this->stat).small_normal_bytes) {
        __assert_fail("small_normal_bytes == stat.small_normal_bytes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1be,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (uVar5 == (this->stat).small_returned_bytes) {
        return true;
      }
      __assert_fail("small_returned_bytes == stat.small_returned_bytes",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x1bf,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
    iVar3 = (int)this->small_normal_size_[lVar2];
    pSVar4 = this->small_normal_ + lVar2;
    while (pSVar4 = pSVar4->next, pSVar4 != this->small_normal_ + lVar2) {
      if (iVar3 < 1) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ab,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (pSVar4->location != 1) {
        __assert_fail("span->location == Span::IN_NORMAL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ac,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(this_00,pSVar4->page_id);
      if (pSVar1 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ad,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(this_00,(pSVar4->page_id + pSVar4->npages) - 1);
      if (pSVar1 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1ae,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar6 = uVar6 + pSVar4->npages * 0x2000;
      iVar3 = iVar3 + -1;
    }
    if (iVar3 != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x1b1,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
    iVar3 = (int)this->small_returned_size_[lVar2];
    pSVar4 = this->small_returned_ + lVar2;
    while (pSVar4 = pSVar4->next, pSVar4 != this->small_returned_ + lVar2) {
      if (iVar3 < 1) {
        __assert_fail("count >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b5,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      if (pSVar4->location != 2) {
        __assert_fail("span->location == Span::IN_RETURNED",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b6,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(this_00,pSVar4->page_id);
      if (pSVar1 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b7,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      pSVar1 = (Span *)PageMap::Get(this_00,(pSVar4->page_id + pSVar4->npages) - 1);
      if (pSVar1 != pSVar4) {
        __assert_fail("page_map_.Get(span->page_id + span->npages - 1) == span",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                      ,0x1b8,"bool tcmalloc::PageHeap::CheckSmallList()");
      }
      uVar5 = uVar5 + pSVar4->npages * 0x2000;
      iVar3 = iVar3 + -1;
    }
    lVar2 = lVar2 + 1;
    if (iVar3 != 0) {
      __assert_fail("count == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/src/page_heap.hpp"
                    ,0x1bb,"bool tcmalloc::PageHeap::CheckSmallList()");
    }
  } while( true );
}

Assistant:

bool CheckSmallList() {
        uint64_t small_normal_bytes = 0;
        uint64_t small_returned_bytes = 0;

        for (int i = 0; i <= spanSmallPages; ++i) {
            int count = small_normal_size_[i];
            for (Span* span = small_normal_[i].next; span != &small_normal_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_NORMAL);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                small_normal_bytes += span->npages * spanPageSize;
            }
            assert(count == 0);
            count = small_returned_size_[i];
            for (Span* span = small_returned_[i].next; span != &small_returned_[i]; span = span->next) {
                count--;
                assert(count >= 0);
                assert(span->location == Span::IN_RETURNED);
                assert(page_map_.Get(span->page_id) == span);
                assert(page_map_.Get(span->page_id + span->npages - 1) == span);
                small_returned_bytes += span->npages * spanPageSize;
            }
            assert(count == 0);
        }

        assert(small_normal_bytes == stat.small_normal_bytes);
        assert(small_returned_bytes == stat.small_returned_bytes);
        return true;
    }